

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::Write3dmBitmap(ON_BinaryArchive *this,ON_Bitmap *bitmap)

{
  bool bVar1;
  ON_3DM_BIG_CHUNK *pOVar2;
  ON_3DM_BIG_CHUNK *c;
  bool rc;
  ON_Bitmap *bitmap_local;
  ON_BinaryArchive *this_local;
  
  bVar1 = ArchiveContains3dmTable(this,bitmap_table);
  if (bVar1) {
    bVar1 = Internal_Begin3dmTableRecord(this,bitmap_table);
    if (bVar1) {
      c._7_1_ = false;
      if (1 < this->m_3dm_version) {
        Internal_Increment3dmTableItemCount(this);
        pOVar2 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Last(&this->m_chunk);
        if ((pOVar2 == (ON_3DM_BIG_CHUNK *)0x0) || (pOVar2->m_typecode != 0x10000016)) {
          Internal_ReportCriticalError(this);
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x2709,"",
                     "ON_BinaryArchive::Write3dmBitmap() must be called in BeginWrite3dmBitmapTable() block"
                    );
          c._7_1_ = false;
        }
        else {
          c._7_1_ = BeginWrite3dmChunk(this,0x20008090,0);
          if (c._7_1_) {
            Internal_Write3dmUpdateManifest(this,&bitmap->super_ON_ModelComponent);
            c._7_1_ = WriteObject(this,(ON_Object *)bitmap);
            bVar1 = EndWrite3dmChunk(this);
            if (!bVar1) {
              c._7_1_ = false;
            }
          }
        }
      }
      this_local._7_1_ = c._7_1_;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::Write3dmBitmap( const ON_Bitmap& bitmap )
{
  if (false == ArchiveContains3dmTable(ON_3dmArchiveTableType::bitmap_table))
    return true;

  if ( false == Internal_Begin3dmTableRecord(ON_3dmArchiveTableType::bitmap_table) )
    return false;

  bool rc = false;
  if ( m_3dm_version > 1 ) 
  {
    Internal_Increment3dmTableItemCount();
    const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
    if ( c && c->m_typecode == TCODE_BITMAP_TABLE ) 
    {
      rc = BeginWrite3dmChunk( TCODE_BITMAP_RECORD, 0 );
      if ( rc )
      {
        Internal_Write3dmUpdateManifest(bitmap);
        rc = WriteObject( bitmap );
        if ( !EndWrite3dmChunk() )
          rc = false;
      }
    }
    else 
    {
      Internal_ReportCriticalError();
      ON_ERROR("ON_BinaryArchive::Write3dmBitmap() must be called in BeginWrite3dmBitmapTable() block");
      rc = false;
    }
  }
  return rc;
}